

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O2

Orphan<capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>_> *
__thiscall
capnp::Orphanage::
newOrphan<capnp::List<capnp::compiler::Declaration::AnnotationApplication,(capnp::Kind)3>>
          (Orphan<capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Orphanage *this,uint size)

{
  OrphanBuilder local_30;
  
  NewOrphanListImpl<capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>_>
  ::apply(&local_30,this->arena,this->capTable,size);
  (__return_storage_ptr__->builder).segment = local_30.segment;
  (__return_storage_ptr__->builder).capTable = local_30.capTable;
  (__return_storage_ptr__->builder).location = local_30.location;
  local_30.segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).tag.content = local_30.tag.content;
  local_30.location = (word *)0x0;
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Orphan<RootType> Orphanage::newOrphan(uint size) const {
  return Orphan<RootType>(NewOrphanListImpl<RootType>::apply(arena, capTable, size));
}